

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_60e82::ProducedNodeTask::inputsAvailable(ProducedNodeTask *this,TaskInterface ti)

{
  bool bVar1;
  BuildSystemImpl *this_00;
  BuildSystemDelegate *pBVar2;
  TaskInterface ti_00;
  ValueType local_d0;
  BuildValue local_b8;
  ValueType local_48;
  ProducedNodeTask *local_30;
  void *local_28;
  ProducedNodeTask *local_20;
  ProducedNodeTask *this_local;
  TaskInterface ti_local;
  
  ti_00.ctx = ti.ctx;
  local_30 = (ProducedNodeTask *)ti.impl;
  local_20 = this;
  this_local = local_30;
  ti_local.impl = ti_00.ctx;
  if ((this->isInvalid & 1U) == 0) {
    bVar1 = llbuild::buildsystem::BuildValue::isInvalid(&this->nodeResult);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      __assert_fail("!nodeResult.isInvalid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/BuildSystem/BuildSystem.cpp"
                    ,0x316,
                    "virtual void (anonymous namespace)::ProducedNodeTask::inputsAvailable(TaskInterface)"
                   );
    }
    llbuild::buildsystem::BuildValue::toData(&local_d0,&this->nodeResult);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_d0,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_d0);
  }
  else {
    ti_00.impl = ti_00.ctx;
    local_28 = ti_00.ctx;
    this_00 = getBuildSystem((anon_unknown_dwarf_60e82 *)local_30,ti_00);
    pBVar2 = BuildSystemImpl::getDelegate(this_00);
    (*pBVar2->_vptr_BuildSystemDelegate[6])();
    llbuild::buildsystem::BuildValue::makeFailedInput();
    llbuild::buildsystem::BuildValue::toData(&local_48,&local_b8);
    llbuild::core::TaskInterface::complete((TaskInterface *)&this_local,&local_48,false);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_48);
    llbuild::buildsystem::BuildValue::~BuildValue(&local_b8);
  }
  return;
}

Assistant:

virtual void inputsAvailable(TaskInterface ti) override {
    if (isInvalid) {
      getBuildSystem(ti).getDelegate().hadCommandFailure();
      ti.complete(BuildValue::makeFailedInput().toData());
      return;
    }
    
    assert(!nodeResult.isInvalid());
    
    // Complete the task immediately.
    ti.complete(nodeResult.toData());
  }